

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

bool __thiscall
crnlib::mipmapped_texture::flip_y(mipmapped_texture *this,bool update_orientation_flags)

{
  orientation_flags_t *poVar1;
  uint uVar2;
  uint uVar3;
  vector<crnlib::mip_level_*> *pvVar4;
  bool bVar5;
  uint f;
  ulong uVar6;
  uint m;
  ulong uVar7;
  mipmapped_texture temp_tex;
  mipmapped_texture local_60;
  
  mipmapped_texture(&local_60,this);
  bVar5 = flip_y_helper(&local_60);
  if (!bVar5) {
    operator=(&local_60,this);
    unpack_from_dxt(&local_60,false);
    bVar5 = flip_y_helper(&local_60);
    if (!bVar5) {
      bVar5 = false;
      goto LAB_00127e55;
    }
  }
  swap(this,&local_60);
  bVar5 = true;
  if (update_orientation_flags) {
    uVar2 = (this->m_faces).m_size;
    pvVar4 = (this->m_faces).m_p;
    for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
      uVar3 = pvVar4[uVar6].m_size;
      for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
        poVar1 = &pvVar4[uVar6].m_p[uVar7]->m_orient_flags;
        *poVar1 = *poVar1 ^ cOrientationFlagYFlipped;
      }
    }
  }
LAB_00127e55:
  ~mipmapped_texture(&local_60);
  return bVar5;
}

Assistant:

bool mipmapped_texture::flip_y(bool update_orientation_flags) {
  mipmapped_texture temp_tex(*this);
  if (!temp_tex.flip_y_helper()) {
    temp_tex = *this;
    temp_tex.unpack_from_dxt(true);
    if (!temp_tex.flip_y_helper())
      return false;
  }
  swap(temp_tex);

  if (update_orientation_flags) {
    for (uint f = 0; f < get_num_faces(); f++) {
      for (uint m = 0; m < get_face(f).size(); m++) {
        uint orient_flags = get_face(f)[m]->get_orientation_flags();
        orient_flags ^= cOrientationFlagYFlipped;
        get_face(f)[m]->set_orientation_flags(static_cast<orientation_flags_t>(orient_flags));
      }
    }
  }

  CRNLIB_ASSERT(check());

  return true;
}